

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

int __thiscall ghc::filesystem::path::compare(path *this,path *p)

{
  char cVar1;
  size_type sVar2;
  size_type sVar3;
  bool bVar4;
  bool bVar5;
  reference pcVar6;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  iter2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  iter1;
  bool hrd2;
  bool hrd1;
  size_type sStack_30;
  int rnc;
  size_type rnl2;
  size_type rnl1;
  path *p_local;
  path *this_local;
  
  rnl1 = (size_type)p;
  p_local = this;
  rnl2 = root_name_length(this);
  sStack_30 = root_name_length((path *)rnl1);
  sVar3 = rnl1;
  sVar2 = rnl2;
  std::min<unsigned_long>(&rnl2,&stack0xffffffffffffffd0);
  iter1._M_current._4_4_ = std::__cxx11::string::compare((ulong)this,0,(string *)sVar2,sVar3,0);
  this_local._4_4_ = iter1._M_current._4_4_;
  if (iter1._M_current._4_4_ == 0) {
    iter1._M_current._3_1_ = has_root_directory(this);
    iter1._M_current._2_1_ = has_root_directory((path *)rnl1);
    if ((iter1._M_current._3_1_ & 1) == iter1._M_current._2_1_) {
      if ((iter1._M_current._3_1_ & 1) != 0) {
        rnl2 = rnl2 + 1;
        sStack_30 = sStack_30 + 1;
      }
      iter2._M_current = (char *)std::__cxx11::string::begin();
      local_40 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator+(&iter2,(long)(int)rnl2);
      local_58._M_current = (char *)std::__cxx11::string::begin();
      local_50 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator+(&local_58,(long)(int)sStack_30);
      while( true ) {
        local_60._M_current = (char *)std::__cxx11::string::end();
        bVar4 = __gnu_cxx::operator!=(&local_40,&local_60);
        bVar5 = false;
        if (bVar4) {
          local_68._M_current = (char *)std::__cxx11::string::end();
          bVar4 = __gnu_cxx::operator!=(&local_50,&local_68);
          bVar5 = false;
          if (bVar4) {
            pcVar6 = __gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&local_40);
            cVar1 = *pcVar6;
            pcVar6 = __gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&local_50);
            bVar5 = cVar1 == *pcVar6;
          }
        }
        if (!bVar5) break;
        __gnu_cxx::
        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&local_40);
        __gnu_cxx::
        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&local_50);
      }
      local_70._M_current = (char *)std::__cxx11::string::end();
      bVar5 = __gnu_cxx::operator==(&local_40,&local_70);
      if (bVar5) {
        local_78._M_current = (char *)std::__cxx11::string::end();
        bVar5 = __gnu_cxx::operator==(&local_50,&local_78);
        this_local._4_4_ = -1;
        if (bVar5) {
          this_local._4_4_ = 0;
        }
      }
      else {
        local_80._M_current = (char *)std::__cxx11::string::end();
        bVar5 = __gnu_cxx::operator==(&local_50,&local_80);
        if (bVar5) {
          this_local._4_4_ = 1;
        }
        else {
          pcVar6 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_40);
          if (*pcVar6 == '/') {
            this_local._4_4_ = -1;
          }
          else {
            pcVar6 = __gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&local_50);
            if (*pcVar6 == '/') {
              this_local._4_4_ = 1;
            }
            else {
              pcVar6 = __gnu_cxx::
                       __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator*(&local_40);
              cVar1 = *pcVar6;
              pcVar6 = __gnu_cxx::
                       __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator*(&local_50);
              this_local._4_4_ = 1;
              if (cVar1 < *pcVar6) {
                this_local._4_4_ = -1;
              }
            }
          }
        }
      }
    }
    else {
      this_local._4_4_ = -1;
      if ((iter1._M_current._3_1_ & 1) != 0) {
        this_local._4_4_ = 1;
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

GHC_INLINE int path::compare(const path& p) const noexcept
{
#ifdef LWG_2936_BEHAVIOUR
    auto rnl1 = root_name_length();
    auto rnl2 = p.root_name_length();
#ifdef GHC_OS_WINDOWS
    auto rnc = detail::compare_simple_insensitive(_path.c_str(), rnl1, p._path.c_str(), rnl2);
#else
    auto rnc = _path.compare(0, rnl1, p._path, 0, (std::min(rnl1, rnl2)));
#endif
    if (rnc) {
        return rnc;
    }
    bool hrd1 = has_root_directory(), hrd2 = p.has_root_directory();
    if (hrd1 != hrd2) {
        return hrd1 ? 1 : -1;
    }
    if (hrd1) {
        ++rnl1;
        ++rnl2;
    }
    auto iter1 = _path.begin() + static_cast<int>(rnl1);
    auto iter2 = p._path.begin() + static_cast<int>(rnl2);
    while (iter1 != _path.end() && iter2 != p._path.end() && *iter1 == *iter2) {
        ++iter1;
        ++iter2;
    }
    if (iter1 == _path.end()) {
        return iter2 == p._path.end() ? 0 : -1;
    }
    if (iter2 == p._path.end()) {
        return 1;
    }
    if (*iter1 == preferred_separator) {
        return -1;
    }
    if (*iter2 == preferred_separator) {
        return 1;
    }
    return *iter1 < *iter2 ? -1 : 1;
#else  // LWG_2936_BEHAVIOUR
#ifdef GHC_OS_WINDOWS
    auto rnl1 = root_name_length();
    auto rnl2 = p.root_name_length();
    auto rnc = detail::compare_simple_insensitive(_path.c_str(), rnl1, p._path.c_str(), rnl2);
    if (rnc) {
        return rnc;
    }
    return _path.compare(rnl1, std::string::npos, p._path, rnl2, std::string::npos);
#else
    return _path.compare(p._path);
#endif
#endif
}